

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O1

PClassActor * CreateNewActor(FScriptPosition *sc,FName *typeName,FName *parentName)

{
  PClass *p;
  PClassActor *pPVar1;
  PClassActor *pPVar2;
  char *message;
  FName local_30;
  FName local_2c;
  
  pPVar1 = (PClassActor *)AActor::RegistrationInfo.MyClass;
  if (parentName->Index == 0) goto LAB_00543142;
  local_2c.Index = parentName->Index;
  p = PClass::FindClass(&local_2c);
  pPVar1 = dyn_cast<PClassActor>((DObject *)p);
  pPVar2 = pPVar1;
  if (pPVar1 == (PClassActor *)0x0) {
    message = "Parent type \'%s\' not found in %s";
  }
  else {
    do {
      if ((pPVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index
          == typeName->Index) {
        FScriptPosition::Message
                  (sc,2,"\'%s\' inherits from a class with the same name",
                   FName::NameData.NameArray[typeName->Index].Text);
        break;
      }
      pPVar2 = dyn_cast<PClassActor>((DObject *)(pPVar2->super_PClass).ParentClass);
    } while (pPVar2 != (PClassActor *)0x0);
    pPVar2 = pPVar1;
    if (pPVar1 == (PClassActor *)AActor::RegistrationInfo.MyClass) goto LAB_00543142;
    do {
      pPVar2 = (PClassActor *)(pPVar2->super_PClass).ParentClass;
      if (pPVar2 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
    } while (pPVar2 != (PClassActor *)0x0);
    if (pPVar2 != (PClassActor *)0x0) goto LAB_00543142;
    message = "Parent type \'%s\' is not an actor in %s";
  }
  FScriptPosition::Message
            (sc,2,message,FName::NameData.NameArray[parentName->Index].Text,
             FName::NameData.NameArray[typeName->Index].Text);
  pPVar1 = (PClassActor *)AActor::RegistrationInfo.MyClass;
LAB_00543142:
  local_30 = (FName)typeName->Index;
  pPVar1 = DecoDerivedClass(sc,pPVar1,&local_30);
  (pPVar1->super_PClass).bDecorateClass = true;
  pPVar1->Replacement = (PClassActor *)0x0;
  pPVar1->Replacee = (PClassActor *)0x0;
  pPVar1->DoomEdNum = -1;
  return pPVar1;
}

Assistant:

PClassActor *CreateNewActor(const FScriptPosition &sc, FName typeName, FName parentName)
{
	PClassActor *replacee = NULL;
	PClassActor *ti = NULL;

	PClassActor *parent = RUNTIME_CLASS(AActor);

	if (parentName != NAME_None)
	{
		parent = PClass::FindActor(parentName);

		PClassActor *p = parent;
		while (p != NULL)
		{
			if (p->TypeName == typeName)
			{
				sc.Message(MSG_ERROR, "'%s' inherits from a class with the same name", typeName.GetChars());
				break;
			}
			p = dyn_cast<PClassActor>(p->ParentClass);
		}

		if (parent == NULL)
		{
			sc.Message(MSG_ERROR, "Parent type '%s' not found in %s", parentName.GetChars(), typeName.GetChars());
			parent = RUNTIME_CLASS(AActor);
		}
		else if (!parent->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			sc.Message(MSG_ERROR, "Parent type '%s' is not an actor in %s", parentName.GetChars(), typeName.GetChars());
			parent = RUNTIME_CLASS(AActor);
		}
	}
	ti = DecoDerivedClass(sc, parent, typeName);
	ti->bDecorateClass = true;	// we only set this for 'modern' DECORATE. The original stuff  is so limited that it cannot do anything that may require flagging.

	ti->Replacee = ti->Replacement = NULL;
	ti->DoomEdNum = -1;
	return ti;
}